

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O2

int UTF_uj32_cmpn(UTF_UC32 *uj32a,UTF_UC32 *uj32b,size_t len)

{
  UTF_UC32 UVar1;
  UTF_UC32 UVar2;
  uint uVar3;
  size_t sVar4;
  
  sVar4 = 0;
  uVar3 = 0xffffffff;
  while( true ) {
    UVar1 = uj32a[sVar4];
    UVar2 = uj32b[sVar4];
    if ((UVar1 == L'\0') || (UVar2 == L'\0')) {
      if ((uint)UVar2 <= (uint)UVar1) {
        uVar3 = (uint)((uint)UVar2 < (uint)UVar1);
      }
      return uVar3;
    }
    if (len == sVar4) {
      return 0;
    }
    if ((uint)UVar1 < (uint)UVar2) break;
    if ((uint)UVar1 >= (uint)UVar2 && UVar1 != UVar2) {
      return 1;
    }
    sVar4 = sVar4 + 1;
  }
  return -1;
}

Assistant:

static __inline int
UTF_uj32_cmpn(const UTF_UC32 *uj32a, const UTF_UC32 *uj32b, UTF_SIZE_T len)
{
    while (*uj32a && *uj32b)
    {
        if (len-- == 0) return 0;
        if (*uj32a < *uj32b) return -1;
        if (*uj32a > *uj32b) return 1;
        ++uj32a;
        ++uj32b;
    }
    if (*uj32a < *uj32b) return -1;
    if (*uj32a > *uj32b) return 1;
    return 0;
}